

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrixAlgo.cpp
# Opt level: O0

bool Imath_3_2::(anonymous_namespace)::jacobiRotation<0,2,1,3,double>
               (Matrix44<double> *A,Matrix44<double> *V,Vec4<double> *Z,double tol)

{
  double dVar1;
  double *pdVar2;
  double *pdVar3;
  Vec4<double> *in_RDX;
  int __x;
  Matrix44<double> *in_RDI;
  Matrix44<double> *pMVar4;
  double in_XMM0_Qa;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double dVar5;
  double extraout_XMM0_Qa_01;
  double dVar6;
  double dVar7;
  double dVar8;
  double nu2_1;
  double nu1_1;
  double *offd2_1;
  double *offd1_1;
  double nu2;
  double nu1;
  double *offd2;
  double *offd1;
  double h;
  double tau;
  double s;
  double c;
  double t;
  double rho;
  double mu2;
  double mu1;
  double z;
  double y;
  double x;
  double tau_00;
  
  pdVar2 = Matrix44<double>::operator[](in_RDI,0);
  dVar5 = *pdVar2;
  pdVar2 = Matrix44<double>::operator[](in_RDI,0);
  dVar1 = pdVar2[2];
  pMVar4 = in_RDI;
  pdVar2 = Matrix44<double>::operator[](in_RDI,2);
  dVar6 = pdVar2[2];
  __x = (int)pMVar4;
  std::abs(__x);
  tau_00 = extraout_XMM0_Qa;
  std::abs(__x);
  if (in_XMM0_Qa * extraout_XMM0_Qa_00 < tau_00) {
    dVar5 = (dVar6 - dVar5) / (dVar1 * 2.0);
    std::abs(__x);
    dVar6 = sqrt(dVar5 * dVar5 + 1.0);
    dVar7 = (double)(~-(ulong)(dVar5 < 0.0) & 0x3ff0000000000000 |
                    (ulong)((uint)(-(ulong)(dVar5 < 0.0) >> 0x20) & 0xbff00000) << 0x20) /
            (extraout_XMM0_Qa_01 + dVar6);
    dVar5 = sqrt(dVar7 * dVar7 + 1.0);
    dVar6 = (1.0 / dVar5) * dVar7;
    dVar8 = dVar6 / (1.0 / dVar5 + 1.0);
    dVar7 = dVar7 * dVar1;
    pdVar2 = Vec4<double>::operator[](in_RDX,0);
    *pdVar2 = *pdVar2 - dVar7;
    pdVar2 = Vec4<double>::operator[](in_RDX,2);
    *pdVar2 = dVar7 + *pdVar2;
    pdVar2 = Matrix44<double>::operator[](in_RDI,0);
    *pdVar2 = *pdVar2 - dVar7;
    pdVar2 = Matrix44<double>::operator[](in_RDI,2);
    pdVar2[2] = dVar7 + pdVar2[2];
    pdVar2 = Matrix44<double>::operator[](in_RDI,0);
    pdVar2[2] = 0.0;
    pdVar2 = Matrix44<double>::operator[](in_RDI,0);
    pdVar2 = pdVar2 + 1;
    pdVar3 = Matrix44<double>::operator[](in_RDI,1);
    pdVar3 = pdVar3 + 2;
    dVar5 = *pdVar2;
    dVar1 = *pdVar3;
    *pdVar2 = -dVar6 * (dVar8 * dVar5 + dVar1) + *pdVar2;
    *pdVar3 = dVar6 * (-dVar8 * dVar1 + dVar5) + *pdVar3;
    pdVar2 = Matrix44<double>::operator[](in_RDI,0);
    pdVar2 = pdVar2 + 3;
    pdVar3 = Matrix44<double>::operator[](in_RDI,2);
    pdVar3 = pdVar3 + 3;
    dVar5 = *pdVar2;
    pMVar4 = (Matrix44<double> *)*pdVar3;
    *pdVar2 = -dVar6 * (dVar8 * dVar5 + (double)pMVar4) + *pdVar2;
    *pdVar3 = dVar6 * (-dVar8 * (double)pMVar4 + dVar5) + *pdVar3;
    jacobiRotateRight<0,2,Imath_3_2::Matrix44<double>>(pMVar4,in_XMM0_Qa,tau_00);
  }
  else {
    pdVar2 = Matrix44<double>::operator[](in_RDI,0);
    pdVar2[2] = 0.0;
  }
  return true;
}

Assistant:

bool
jacobiRotation (Matrix44<T>& A, Matrix44<T>& V, Vec4<T>& Z, const T tol)
{
    const T x = A[j][j];
    const T y = A[j][k];
    const T z = A[k][k];

    const T mu1 = z - x;
    const T mu2 = T (2) * y;

    // Let's see if rho^(-1) = mu2 / mu1 is less than tol
    // This test also checks if rho^2 will overflow
    // when tol^(-1) < sqrt(std::numeric_limits<T>::max()).
    if (std::abs (mu2) <= tol * std::abs (mu1))
    {
        A[j][k] = 0;
        return true;
    }

    const T rho = mu1 / mu2;
    const T t   = (rho < 0 ? T (-1) : T (1)) /
                (std::abs (rho) + std::sqrt (1 + rho * rho));
    const T c   = T (1) / std::sqrt (T (1) + t * t);
    const T s   = c * t;
    const T tau = s / (T (1) + c);
    const T h   = t * y;

    Z[j] -= h;
    Z[k] += h;
    A[j][j] -= h;
    A[k][k] += h;
    A[j][k] = 0;

    {
        T&      offd1 = l1 < j ? A[l1][j] : A[j][l1];
        T&      offd2 = l1 < k ? A[l1][k] : A[k][l1];
        const T nu1   = offd1;
        const T nu2   = offd2;
        offd1 -= s * (nu2 + tau * nu1);
        offd2 += s * (nu1 - tau * nu2);
    }

    {
        T&      offd1 = l2 < j ? A[l2][j] : A[j][l2];
        T&      offd2 = l2 < k ? A[l2][k] : A[k][l2];
        const T nu1   = offd1;
        const T nu2   = offd2;
        offd1 -= s * (nu2 + tau * nu1);
        offd2 += s * (nu1 - tau * nu2);
    }

    jacobiRotateRight<j, k> (V, s, tau);

    return true;
}